

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> __thiscall
anon_unknown.dwarf_1352d2::BuildSystemFileDelegate::lookupTool
          (BuildSystemFileDelegate *this,StringRef name)

{
  int iVar1;
  Tool *this_00;
  undefined **ppuVar2;
  long in_RCX;
  char *__s1;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> *tool;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  StringRef name_07;
  StringRef name_08;
  
  __s1 = (char *)name.Length;
  (**(code **)(**(long **)(*(long *)(name.Data + 8) + 8) + 0x20))();
  if ((this->super_BuildFileDelegate)._vptr_BuildFileDelegate != (_func_int **)0x0) {
    return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
              )this;
  }
  std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>::
  ~unique_ptr((unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
               *)this);
  if (in_RCX == 0x12) {
    iVar1 = bcmp(__s1,"stale-file-removal",0x12);
    if (iVar1 != 0) goto LAB_00149546;
    this_00 = (Tool *)operator_new(0x28);
    name_06.Length = 0x12;
    name_06.Data = __s1;
    llbuild::buildsystem::Tool::Tool(this_00,name_06);
    ppuVar2 = &PTR__Tool_0023cce8;
  }
  else if (in_RCX == 7) {
    iVar1 = bcmp(__s1,"symlink",7);
    if (iVar1 == 0) {
      this_00 = (Tool *)operator_new(0x30);
      name_03.Length = 7;
      name_03.Data = __s1;
      llbuild::buildsystem::Tool::Tool(this_00,name_03);
      this_00->_vptr_Tool = (_func_int **)&PTR__Tool_0023c960;
      *(undefined1 *)&this_00[1]._vptr_Tool = 0;
      goto LAB_00149631;
    }
    iVar1 = bcmp(__s1,"archive",7);
    if (iVar1 != 0) goto LAB_00149546;
    this_00 = (Tool *)operator_new(0x28);
    name_01.Length = 7;
    name_01.Data = __s1;
    llbuild::buildsystem::Tool::Tool(this_00,name_01);
    ppuVar2 = &PTR__Tool_0023ca78;
  }
  else if (in_RCX == 0xe) {
    iVar1 = bcmp(__s1,"shared-library",0xe);
    if (iVar1 == 0) {
      this_00 = (Tool *)operator_new(0x28);
      name_05.Length = 0xe;
      name_05.Data = __s1;
      llbuild::buildsystem::Tool::Tool(this_00,name_05);
      ppuVar2 = &PTR__Tool_0023cbb0;
    }
    else {
      iVar1 = bcmp(__s1,"swift-compiler",0xe);
      if (iVar1 != 0) goto LAB_00149546;
      this_00 = (Tool *)operator_new(0x28);
      name_02.Length = 0xe;
      name_02.Data = __s1;
      llbuild::buildsystem::Tool::Tool(this_00,name_02);
      ppuVar2 = &PTR__Tool_0023ce00;
    }
  }
  else {
    if (in_RCX != 5) {
LAB_00149546:
      this_00 = (Tool *)0x0;
      goto LAB_00149631;
    }
    iVar1 = bcmp(__s1,"shell",5);
    if (iVar1 == 0) {
      this_00 = (Tool *)operator_new(0x30);
      name_04.Length = 5;
      name_04.Data = __s1;
      llbuild::buildsystem::Tool::Tool(this_00,name_04);
      this_00->_vptr_Tool = (_func_int **)&PTR__Tool_0023c530;
      *(undefined1 *)&this_00[1]._vptr_Tool = 1;
      goto LAB_00149631;
    }
    iVar1 = bcmp(__s1,"phony",5);
    if (iVar1 == 0) {
      this_00 = (Tool *)operator_new(0x28);
      name_07.Length = 5;
      name_07.Data = __s1;
      llbuild::buildsystem::Tool::Tool(this_00,name_07);
      ppuVar2 = &PTR__Tool_0023c578;
    }
    else {
      iVar1 = bcmp(__s1,"clang",5);
      if (iVar1 == 0) {
        this_00 = (Tool *)operator_new(0x28);
        name_08.Length = 5;
        name_08.Data = __s1;
        llbuild::buildsystem::Tool::Tool(this_00,name_08);
        ppuVar2 = &PTR__Tool_0023c6b0;
      }
      else {
        iVar1 = bcmp(__s1,"mkdir",5);
        if (iVar1 != 0) goto LAB_00149546;
        this_00 = (Tool *)operator_new(0x28);
        name_00.Length = 5;
        name_00.Data = __s1;
        llbuild::buildsystem::Tool::Tool(this_00,name_00);
        ppuVar2 = &PTR__Tool_0023c828;
      }
    }
  }
  this_00->_vptr_Tool = (_func_int **)ppuVar2;
LAB_00149631:
  (this->super_BuildFileDelegate)._vptr_BuildFileDelegate = (_func_int **)this_00;
  return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Tool>
BuildSystemFileDelegate::lookupTool(StringRef name) {
  // First, give the client an opportunity to create the tool.
  if (auto tool = getSystemDelegate().lookupTool(name)) {
    return tool;
  }

  // Otherwise, look for one of the builtin tool definitions.
  if (name == "shell") {
    return llvm::make_unique<ShellTool>(name);
  } else if (name == "phony") {
    return llvm::make_unique<PhonyTool>(name);
  } else if (name == "clang") {
    return llvm::make_unique<ClangTool>(name);
  } else if (name == "mkdir") {
    return llvm::make_unique<MkdirTool>(name);
  } else if (name == "symlink") {
    return llvm::make_unique<SymlinkTool>(name);
  } else if (name == "archive") {
    return llvm::make_unique<ArchiveTool>(name);
  } else if (name == "shared-library") {
    return llvm::make_unique<SharedLibraryTool>(name);
  } else if (name == "stale-file-removal") {
    return llvm::make_unique<StaleFileRemovalTool>(name);
  } else if (name == "swift-compiler") {
    return llvm::make_unique<SwiftCompilerTool>(name);
  }

  return nullptr;
}